

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_get_rows(ggml_compute_params *params,ggml_tensor *dst)

{
  long in_RSI;
  ggml_tensor *src0;
  ggml_tensor *in_stack_000000f8;
  ggml_compute_params *in_stack_00000100;
  ggml_tensor *in_stack_00000108;
  ggml_compute_params *in_stack_00000110;
  
  switch(**(undefined4 **)(in_RSI + 0x98)) {
  case 0:
  case 0x1a:
    ggml_compute_forward_get_rows_f32(in_stack_00000100,in_stack_000000f8);
    break;
  case 1:
    ggml_compute_forward_get_rows_f16(in_stack_00000100,in_stack_000000f8);
    break;
  case 2:
  case 3:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x1d:
  case 0x22:
  case 0x23:
    ggml_compute_forward_get_rows_q(in_stack_00000110,in_stack_00000108);
    break;
  default:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x1108,"fatal error");
    break;
  case 0x1e:
    ggml_compute_forward_get_rows_bf16(in_stack_00000100,in_stack_000000f8);
  }
  return;
}

Assistant:

void ggml_compute_forward_get_rows(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
            {
                ggml_compute_forward_get_rows_q(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_get_rows_f16(params, dst);
            } break;
        case GGML_TYPE_BF16:
            {
                ggml_compute_forward_get_rows_bf16(params, dst);
            } break;
        case GGML_TYPE_F32:
        case GGML_TYPE_I32:
            {
                ggml_compute_forward_get_rows_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }

    //static bool first = true;
    //printf("ne0 = %d, ne1 = %d, ne2 = %d\n", dst->ne[0], dst->ne[1], dst->ne[2]);
    //if (first) {
    //    first = false;
    //} else {
    //    for (int k = 0; k < dst->ne[1]; ++k) {
    //        for (int j = 0; j < dst->ne[0]/16; ++j) {
    //            for (int i = 0; i < 16; ++i) {
    //                printf("%8.4f ", ((float *) dst->data)[k*dst->ne[0] + j*16 + i]);
    //            }
    //            printf("\n");
    //        }
    //        printf("\n");
    //    }
    //    printf("\n");
    //    exit(0);
    //}
}